

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QAngle.cpp
# Opt level: O1

void test_qclab_QAngle<double>(void)

{
  char *pcVar1;
  double cos;
  double sin;
  AssertionResult gtest_ar;
  char *in_stack_ffffffffffffffb8;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_40;
  AssertHelper local_38;
  internal in_stack_ffffffffffffffd0;
  undefined7 in_stack_ffffffffffffffd1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffd8;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  in_stack_ffffffffffffffe0;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  _Var2;
  AssertHelper in_stack_ffffffffffffffe8;
  
  local_40._M_head_impl =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x3ff0000000000000
  ;
  local_38.data_._0_4_ = 1;
  testing::internal::CmpHelperEQ<double,int>
            ((internal *)&stack0xffffffffffffffd0,"angle.cos()","1",(double *)&local_40,
             (int *)&local_38);
  if (in_stack_ffffffffffffffd0 == (internal)0x0) {
    testing::Message::Message((Message *)&local_40);
    if (in_stack_ffffffffffffffd8 ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = (in_stack_ffffffffffffffd8->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_38,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/QAngle.cpp"
               ,0xd,pcVar1);
    testing::internal::AssertHelper::operator=(&local_38,(Message *)&local_40);
    testing::internal::AssertHelper::~AssertHelper(&local_38);
    if (local_40._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_40._M_head_impl + 8))();
    }
  }
  if (in_stack_ffffffffffffffd8 !=
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&stack0xffffffffffffffd8,in_stack_ffffffffffffffd8);
  }
  local_40._M_head_impl =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  local_38.data_ = local_38.data_ & 0xffffffff00000000;
  testing::internal::CmpHelperEQ<double,int>
            ((internal *)&stack0xffffffffffffffd0,"angle.sin()","0",(double *)&local_40,
             (int *)&local_38);
  if (in_stack_ffffffffffffffd0 == (internal)0x0) {
    testing::Message::Message((Message *)&local_40);
    if (in_stack_ffffffffffffffd8 ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = (in_stack_ffffffffffffffd8->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_38,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/QAngle.cpp"
               ,0xe,pcVar1);
    testing::internal::AssertHelper::operator=(&local_38,(Message *)&local_40);
    testing::internal::AssertHelper::~AssertHelper(&local_38);
    if (local_40._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_40._M_head_impl + 8))();
    }
  }
  if (in_stack_ffffffffffffffd8 !=
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&stack0xffffffffffffffd8,in_stack_ffffffffffffffd8);
  }
  local_40._M_head_impl =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  local_38.data_ = local_38.data_ & 0xffffffff00000000;
  testing::internal::CmpHelperEQ<double,int>
            ((internal *)&stack0xffffffffffffffd0,"angle.theta()","0",(double *)&local_40,
             (int *)&local_38);
  if (in_stack_ffffffffffffffd0 == (internal)0x0) {
    testing::Message::Message((Message *)&local_40);
    if (in_stack_ffffffffffffffd8 ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = (in_stack_ffffffffffffffd8->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_38,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/QAngle.cpp"
               ,0xf,pcVar1);
    testing::internal::AssertHelper::operator=(&local_38,(Message *)&local_40);
    testing::internal::AssertHelper::~AssertHelper(&local_38);
    if (local_40._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_40._M_head_impl + 8))();
    }
  }
  if (in_stack_ffffffffffffffd8 !=
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&stack0xffffffffffffffd8,in_stack_ffffffffffffffd8);
  }
  testing::internal::DoubleNearPredFormat
            (in_stack_ffffffffffffffb8,(char *)0x12d8cf,(char *)in_stack_ffffffffffffffe8.data_,
             (double)in_stack_ffffffffffffffe0._M_head_impl,(double)in_stack_ffffffffffffffd8,
             (double)CONCAT71(in_stack_ffffffffffffffd1,in_stack_ffffffffffffffd0));
  if (in_stack_ffffffffffffffd0 == (internal)0x0) {
    testing::Message::Message((Message *)&local_40);
    if (in_stack_ffffffffffffffd8 ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = (in_stack_ffffffffffffffd8->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_38,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/QAngle.cpp"
               ,0x14,pcVar1);
    testing::internal::AssertHelper::operator=(&local_38,(Message *)&local_40);
    testing::internal::AssertHelper::~AssertHelper(&local_38);
    if (local_40._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_40._M_head_impl + 8))();
    }
  }
  if (in_stack_ffffffffffffffd8 !=
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&stack0xffffffffffffffd8,in_stack_ffffffffffffffd8);
  }
  testing::internal::DoubleNearPredFormat
            (in_stack_ffffffffffffffb8,(char *)0x12d981,(char *)in_stack_ffffffffffffffe8.data_,
             (double)in_stack_ffffffffffffffe0._M_head_impl,(double)in_stack_ffffffffffffffd8,
             (double)CONCAT71(in_stack_ffffffffffffffd1,in_stack_ffffffffffffffd0));
  if (in_stack_ffffffffffffffd0 == (internal)0x0) {
    testing::Message::Message((Message *)&local_40);
    if (in_stack_ffffffffffffffd8 ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = (in_stack_ffffffffffffffd8->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_38,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/QAngle.cpp"
               ,0x15,pcVar1);
    testing::internal::AssertHelper::operator=(&local_38,(Message *)&local_40);
    testing::internal::AssertHelper::~AssertHelper(&local_38);
    if (local_40._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_40._M_head_impl + 8))();
    }
  }
  if (in_stack_ffffffffffffffd8 !=
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&stack0xffffffffffffffd8,in_stack_ffffffffffffffd8);
  }
  testing::internal::DoubleNearPredFormat
            (in_stack_ffffffffffffffb8,(char *)0x12da33,(char *)in_stack_ffffffffffffffe8.data_,
             (double)in_stack_ffffffffffffffe0._M_head_impl,(double)in_stack_ffffffffffffffd8,
             (double)CONCAT71(in_stack_ffffffffffffffd1,in_stack_ffffffffffffffd0));
  if (in_stack_ffffffffffffffd0 == (internal)0x0) {
    testing::Message::Message((Message *)&local_40);
    if (in_stack_ffffffffffffffd8 ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = (in_stack_ffffffffffffffd8->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_38,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/QAngle.cpp"
               ,0x16,pcVar1);
    testing::internal::AssertHelper::operator=(&local_38,(Message *)&local_40);
    testing::internal::AssertHelper::~AssertHelper(&local_38);
    if (local_40._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_40._M_head_impl + 8))();
    }
  }
  if (in_stack_ffffffffffffffd8 !=
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&stack0xffffffffffffffd8,in_stack_ffffffffffffffd8);
  }
  local_40._M_head_impl =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
       &DAT_3c91a62633145c07;
  local_38.data_ = (AssertHelperData *)&DAT_3c91a62633145c07;
  testing::internal::CmpHelperEQ<double,double>
            ((internal *)&stack0xffffffffffffffd0,"angle.cos()","std::cos( pi/2 )",
             (double *)&local_40,(double *)&local_38);
  if (in_stack_ffffffffffffffd0 == (internal)0x0) {
    testing::Message::Message((Message *)&local_40);
    if (in_stack_ffffffffffffffd8 ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = (in_stack_ffffffffffffffd8->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_38,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/QAngle.cpp"
               ,0x1a,pcVar1);
    testing::internal::AssertHelper::operator=(&local_38,(Message *)&local_40);
    testing::internal::AssertHelper::~AssertHelper(&local_38);
    if (local_40._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_40._M_head_impl + 8))();
    }
  }
  if (in_stack_ffffffffffffffd8 !=
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&stack0xffffffffffffffd8,in_stack_ffffffffffffffd8);
  }
  local_40._M_head_impl =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x3ff0000000000000
  ;
  local_38.data_ = (AssertHelperData *)&DAT_3ff0000000000000;
  testing::internal::CmpHelperEQ<double,double>
            ((internal *)&stack0xffffffffffffffd0,"angle.sin()","std::sin( pi/2 )",
             (double *)&local_40,(double *)&local_38);
  if (in_stack_ffffffffffffffd0 == (internal)0x0) {
    testing::Message::Message((Message *)&local_40);
    if (in_stack_ffffffffffffffd8 ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = (in_stack_ffffffffffffffd8->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_38,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/QAngle.cpp"
               ,0x1b,pcVar1);
    testing::internal::AssertHelper::operator=(&local_38,(Message *)&local_40);
    testing::internal::AssertHelper::~AssertHelper(&local_38);
    if (local_40._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_40._M_head_impl + 8))();
    }
  }
  if (in_stack_ffffffffffffffd8 !=
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&stack0xffffffffffffffd8,in_stack_ffffffffffffffd8);
  }
  testing::internal::DoubleNearPredFormat
            (in_stack_ffffffffffffffb8,(char *)0x12dc3f,(char *)in_stack_ffffffffffffffe8.data_,
             (double)in_stack_ffffffffffffffe0._M_head_impl,(double)in_stack_ffffffffffffffd8,
             (double)CONCAT71(in_stack_ffffffffffffffd1,in_stack_ffffffffffffffd0));
  if (in_stack_ffffffffffffffd0 == (internal)0x0) {
    testing::Message::Message((Message *)&local_40);
    if (in_stack_ffffffffffffffd8 ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = (in_stack_ffffffffffffffd8->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_38,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/QAngle.cpp"
               ,0x1c,pcVar1);
    testing::internal::AssertHelper::operator=(&local_38,(Message *)&local_40);
    testing::internal::AssertHelper::~AssertHelper(&local_38);
    if (local_40._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_40._M_head_impl + 8))();
    }
  }
  if (in_stack_ffffffffffffffd8 !=
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&stack0xffffffffffffffd8,in_stack_ffffffffffffffd8);
  }
  local_40._M_head_impl =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
       &DAT_3fe0000000000001;
  local_38.data_ = (AssertHelperData *)&DAT_3fe0000000000001;
  testing::internal::CmpHelperEQ<double,double>
            ((internal *)&stack0xffffffffffffffd0,"angle.cos()","std::cos( pi/3 )",
             (double *)&local_40,(double *)&local_38);
  if (in_stack_ffffffffffffffd0 == (internal)0x0) {
    testing::Message::Message((Message *)&local_40);
    if (in_stack_ffffffffffffffd8 ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = (in_stack_ffffffffffffffd8->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_38,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/QAngle.cpp"
               ,0x20,pcVar1);
    testing::internal::AssertHelper::operator=(&local_38,(Message *)&local_40);
    testing::internal::AssertHelper::~AssertHelper(&local_38);
    if (local_40._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_40._M_head_impl + 8))();
    }
  }
  if (in_stack_ffffffffffffffd8 !=
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&stack0xffffffffffffffd8,in_stack_ffffffffffffffd8);
  }
  local_40._M_head_impl =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
       &DAT_3febb67ae8584caa;
  local_38.data_ = (AssertHelperData *)&DAT_3febb67ae8584caa;
  testing::internal::CmpHelperEQ<double,double>
            ((internal *)&stack0xffffffffffffffd0,"angle.sin()","std::sin( pi/3 )",
             (double *)&local_40,(double *)&local_38);
  if (in_stack_ffffffffffffffd0 == (internal)0x0) {
    testing::Message::Message((Message *)&local_40);
    if (in_stack_ffffffffffffffd8 ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = (in_stack_ffffffffffffffd8->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_38,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/QAngle.cpp"
               ,0x21,pcVar1);
    testing::internal::AssertHelper::operator=(&local_38,(Message *)&local_40);
    testing::internal::AssertHelper::~AssertHelper(&local_38);
    if (local_40._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_40._M_head_impl + 8))();
    }
  }
  if (in_stack_ffffffffffffffd8 !=
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&stack0xffffffffffffffd8,in_stack_ffffffffffffffd8);
  }
  testing::internal::DoubleNearPredFormat
            (in_stack_ffffffffffffffb8,(char *)0x12de55,(char *)in_stack_ffffffffffffffe8.data_,
             (double)in_stack_ffffffffffffffe0._M_head_impl,(double)in_stack_ffffffffffffffd8,
             (double)CONCAT71(in_stack_ffffffffffffffd1,in_stack_ffffffffffffffd0));
  if (in_stack_ffffffffffffffd0 == (internal)0x0) {
    testing::Message::Message((Message *)&local_40);
    if (in_stack_ffffffffffffffd8 ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = (in_stack_ffffffffffffffd8->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_38,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/QAngle.cpp"
               ,0x22,pcVar1);
    testing::internal::AssertHelper::operator=(&local_38,(Message *)&local_40);
    testing::internal::AssertHelper::~AssertHelper(&local_38);
    if (local_40._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_40._M_head_impl + 8))();
    }
  }
  if (in_stack_ffffffffffffffd8 !=
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&stack0xffffffffffffffd8,in_stack_ffffffffffffffd8);
  }
  testing::internal::DoubleNearPredFormat
            (in_stack_ffffffffffffffb8,(char *)0x12df07,(char *)in_stack_ffffffffffffffe8.data_,
             (double)in_stack_ffffffffffffffe0._M_head_impl,(double)in_stack_ffffffffffffffd8,
             (double)CONCAT71(in_stack_ffffffffffffffd1,in_stack_ffffffffffffffd0));
  if (in_stack_ffffffffffffffd0 == (internal)0x0) {
    testing::Message::Message((Message *)&local_40);
    if (in_stack_ffffffffffffffd8 ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = (in_stack_ffffffffffffffd8->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_38,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/QAngle.cpp"
               ,0x32,pcVar1);
    testing::internal::AssertHelper::operator=(&local_38,(Message *)&local_40);
    testing::internal::AssertHelper::~AssertHelper(&local_38);
    if (local_40._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_40._M_head_impl + 8))();
    }
  }
  if (in_stack_ffffffffffffffd8 !=
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&stack0xffffffffffffffd8,in_stack_ffffffffffffffd8);
  }
  testing::internal::DoubleNearPredFormat
            (in_stack_ffffffffffffffb8,(char *)0x12dfb9,(char *)in_stack_ffffffffffffffe8.data_,
             (double)in_stack_ffffffffffffffe0._M_head_impl,(double)in_stack_ffffffffffffffd8,
             (double)CONCAT71(in_stack_ffffffffffffffd1,in_stack_ffffffffffffffd0));
  if (in_stack_ffffffffffffffd0 == (internal)0x0) {
    testing::Message::Message((Message *)&local_40);
    if (in_stack_ffffffffffffffd8 ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = (in_stack_ffffffffffffffd8->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_38,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/QAngle.cpp"
               ,0x33,pcVar1);
    testing::internal::AssertHelper::operator=(&local_38,(Message *)&local_40);
    testing::internal::AssertHelper::~AssertHelper(&local_38);
    if (local_40._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_40._M_head_impl + 8))();
    }
  }
  if (in_stack_ffffffffffffffd8 !=
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&stack0xffffffffffffffd8,in_stack_ffffffffffffffd8);
  }
  testing::internal::DoubleNearPredFormat
            (in_stack_ffffffffffffffb8,(char *)0x12e06b,(char *)in_stack_ffffffffffffffe8.data_,
             (double)in_stack_ffffffffffffffe0._M_head_impl,(double)in_stack_ffffffffffffffd8,
             (double)CONCAT71(in_stack_ffffffffffffffd1,in_stack_ffffffffffffffd0));
  if (in_stack_ffffffffffffffd0 == (internal)0x0) {
    testing::Message::Message((Message *)&local_40);
    if (in_stack_ffffffffffffffd8 ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = (in_stack_ffffffffffffffd8->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_38,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/QAngle.cpp"
               ,0x34,pcVar1);
    testing::internal::AssertHelper::operator=(&local_38,(Message *)&local_40);
    testing::internal::AssertHelper::~AssertHelper(&local_38);
    if (local_40._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_40._M_head_impl + 8))();
    }
  }
  if (in_stack_ffffffffffffffd8 !=
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&stack0xffffffffffffffd8,in_stack_ffffffffffffffd8);
  }
  testing::internal::DoubleNearPredFormat
            (in_stack_ffffffffffffffb8,(char *)0x12e11d,(char *)in_stack_ffffffffffffffe8.data_,
             (double)in_stack_ffffffffffffffe0._M_head_impl,(double)in_stack_ffffffffffffffd8,
             (double)CONCAT71(in_stack_ffffffffffffffd1,in_stack_ffffffffffffffd0));
  if (in_stack_ffffffffffffffd0 == (internal)0x0) {
    testing::Message::Message((Message *)&local_40);
    if (in_stack_ffffffffffffffd8 ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = (in_stack_ffffffffffffffd8->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_38,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/QAngle.cpp"
               ,0x3d,pcVar1);
    testing::internal::AssertHelper::operator=(&local_38,(Message *)&local_40);
    testing::internal::AssertHelper::~AssertHelper(&local_38);
    if (local_40._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_40._M_head_impl + 8))();
    }
  }
  if (in_stack_ffffffffffffffd8 !=
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&stack0xffffffffffffffd8,in_stack_ffffffffffffffd8);
  }
  testing::internal::DoubleNearPredFormat
            (in_stack_ffffffffffffffb8,(char *)0x12e1cf,(char *)in_stack_ffffffffffffffe8.data_,
             (double)in_stack_ffffffffffffffe0._M_head_impl,(double)in_stack_ffffffffffffffd8,
             (double)CONCAT71(in_stack_ffffffffffffffd1,in_stack_ffffffffffffffd0));
  if (in_stack_ffffffffffffffd0 == (internal)0x0) {
    testing::Message::Message((Message *)&local_40);
    if (in_stack_ffffffffffffffd8 ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = (in_stack_ffffffffffffffd8->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_38,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/QAngle.cpp"
               ,0x3e,pcVar1);
    testing::internal::AssertHelper::operator=(&local_38,(Message *)&local_40);
    testing::internal::AssertHelper::~AssertHelper(&local_38);
    if (local_40._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_40._M_head_impl + 8))();
    }
  }
  if (in_stack_ffffffffffffffd8 !=
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&stack0xffffffffffffffd8,in_stack_ffffffffffffffd8);
  }
  testing::internal::DoubleNearPredFormat
            (in_stack_ffffffffffffffb8,(char *)0x12e281,(char *)in_stack_ffffffffffffffe8.data_,
             (double)in_stack_ffffffffffffffe0._M_head_impl,(double)in_stack_ffffffffffffffd8,
             (double)CONCAT71(in_stack_ffffffffffffffd1,in_stack_ffffffffffffffd0));
  if (in_stack_ffffffffffffffd0 == (internal)0x0) {
    testing::Message::Message((Message *)&local_40);
    if (in_stack_ffffffffffffffd8 ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = (in_stack_ffffffffffffffd8->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_38,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/QAngle.cpp"
               ,0x3f,pcVar1);
    testing::internal::AssertHelper::operator=(&local_38,(Message *)&local_40);
    testing::internal::AssertHelper::~AssertHelper(&local_38);
    if (local_40._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_40._M_head_impl + 8))();
    }
  }
  if (in_stack_ffffffffffffffd8 !=
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&stack0xffffffffffffffd8,in_stack_ffffffffffffffd8);
  }
  testing::internal::DoubleNearPredFormat
            (in_stack_ffffffffffffffb8,(char *)0x12e333,(char *)in_stack_ffffffffffffffe8.data_,
             (double)in_stack_ffffffffffffffe0._M_head_impl,(double)in_stack_ffffffffffffffd8,
             (double)CONCAT71(in_stack_ffffffffffffffd1,in_stack_ffffffffffffffd0));
  if (in_stack_ffffffffffffffd0 == (internal)0x0) {
    testing::Message::Message((Message *)&local_40);
    if (in_stack_ffffffffffffffd8 ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = (in_stack_ffffffffffffffd8->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_38,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/QAngle.cpp"
               ,0x48,pcVar1);
    testing::internal::AssertHelper::operator=(&local_38,(Message *)&local_40);
    testing::internal::AssertHelper::~AssertHelper(&local_38);
    if (local_40._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_40._M_head_impl + 8))();
    }
  }
  if (in_stack_ffffffffffffffd8 !=
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&stack0xffffffffffffffd8,in_stack_ffffffffffffffd8);
  }
  testing::internal::DoubleNearPredFormat
            (in_stack_ffffffffffffffb8,(char *)0x12e3e5,(char *)in_stack_ffffffffffffffe8.data_,
             (double)in_stack_ffffffffffffffe0._M_head_impl,(double)in_stack_ffffffffffffffd8,
             (double)CONCAT71(in_stack_ffffffffffffffd1,in_stack_ffffffffffffffd0));
  if (in_stack_ffffffffffffffd0 == (internal)0x0) {
    testing::Message::Message((Message *)&local_40);
    if (in_stack_ffffffffffffffd8 ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = (in_stack_ffffffffffffffd8->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_38,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/QAngle.cpp"
               ,0x49,pcVar1);
    testing::internal::AssertHelper::operator=(&local_38,(Message *)&local_40);
    testing::internal::AssertHelper::~AssertHelper(&local_38);
    if (local_40._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_40._M_head_impl + 8))();
    }
  }
  if (in_stack_ffffffffffffffd8 !=
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&stack0xffffffffffffffd8,in_stack_ffffffffffffffd8);
  }
  testing::internal::DoubleNearPredFormat
            (in_stack_ffffffffffffffb8,(char *)0x12e497,(char *)in_stack_ffffffffffffffe8.data_,
             (double)in_stack_ffffffffffffffe0._M_head_impl,(double)in_stack_ffffffffffffffd8,
             (double)CONCAT71(in_stack_ffffffffffffffd1,in_stack_ffffffffffffffd0));
  if (in_stack_ffffffffffffffd0 == (internal)0x0) {
    testing::Message::Message((Message *)&local_40);
    if (in_stack_ffffffffffffffd8 ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = (in_stack_ffffffffffffffd8->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_38,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/QAngle.cpp"
               ,0x4a,pcVar1);
    testing::internal::AssertHelper::operator=(&local_38,(Message *)&local_40);
    testing::internal::AssertHelper::~AssertHelper(&local_38);
    if (local_40._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_40._M_head_impl + 8))();
    }
  }
  if (in_stack_ffffffffffffffd8 !=
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&stack0xffffffffffffffd8,in_stack_ffffffffffffffd8);
  }
  local_40._M_head_impl =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
       &DAT_3fe6a09e667f3bcd;
  local_38.data_ = (AssertHelperData *)&DAT_3fe6a09e667f3bcc;
  _Var2._M_head_impl =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
       &DAT_3fe6a09e667f3bcd;
  testing::internal::CmpHelperEQ<double,double>
            ((internal *)&stack0xffffffffffffffd0,"angle.cos()","cos",
             (double *)&stack0xffffffffffffffe0,(double *)&local_40);
  if (in_stack_ffffffffffffffd0 == (internal)0x0) {
    testing::Message::Message((Message *)&stack0xffffffffffffffe0);
    if (in_stack_ffffffffffffffd8 ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = (in_stack_ffffffffffffffd8->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&stack0xffffffffffffffe8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/QAngle.cpp"
               ,0x53,pcVar1);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)&stack0xffffffffffffffe8,(Message *)&stack0xffffffffffffffe0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&stack0xffffffffffffffe8);
    if (_Var2._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)_Var2._M_head_impl + 8))();
    }
  }
  if (in_stack_ffffffffffffffd8 !=
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&stack0xffffffffffffffd8,in_stack_ffffffffffffffd8);
  }
  _Var2._M_head_impl =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
       &DAT_3fe6a09e667f3bcc;
  testing::internal::CmpHelperEQ<double,double>
            ((internal *)&stack0xffffffffffffffd0,"angle.sin()","sin",
             (double *)&stack0xffffffffffffffe0,(double *)&local_38);
  if (in_stack_ffffffffffffffd0 == (internal)0x0) {
    testing::Message::Message((Message *)&stack0xffffffffffffffe0);
    if (in_stack_ffffffffffffffd8 ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = (in_stack_ffffffffffffffd8->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&stack0xffffffffffffffe8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/QAngle.cpp"
               ,0x54,pcVar1);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)&stack0xffffffffffffffe8,(Message *)&stack0xffffffffffffffe0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&stack0xffffffffffffffe8);
    if (_Var2._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)_Var2._M_head_impl + 8))();
    }
  }
  if (in_stack_ffffffffffffffd8 !=
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&stack0xffffffffffffffd8,in_stack_ffffffffffffffd8);
  }
  testing::internal::DoubleNearPredFormat
            (in_stack_ffffffffffffffb8,(char *)0x12e6af,(char *)in_stack_ffffffffffffffe8.data_,
             (double)_Var2._M_head_impl,(double)in_stack_ffffffffffffffd8,
             (double)CONCAT71(in_stack_ffffffffffffffd1,in_stack_ffffffffffffffd0));
  if (in_stack_ffffffffffffffd0 == (internal)0x0) {
    testing::Message::Message((Message *)&stack0xffffffffffffffe0);
    if (in_stack_ffffffffffffffd8 ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = (in_stack_ffffffffffffffd8->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&stack0xffffffffffffffe8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/QAngle.cpp"
               ,0x55,pcVar1);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)&stack0xffffffffffffffe8,(Message *)&stack0xffffffffffffffe0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&stack0xffffffffffffffe8);
    if (_Var2._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)_Var2._M_head_impl + 8))();
    }
  }
  if (in_stack_ffffffffffffffd8 !=
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&stack0xffffffffffffffd8,in_stack_ffffffffffffffd8);
  }
  testing::internal::DoubleNearPredFormat
            (in_stack_ffffffffffffffb8,(char *)0x12e766,(char *)in_stack_ffffffffffffffe8.data_,
             (double)_Var2._M_head_impl,(double)in_stack_ffffffffffffffd8,
             (double)CONCAT71(in_stack_ffffffffffffffd1,in_stack_ffffffffffffffd0));
  if (in_stack_ffffffffffffffd0 == (internal)0x0) {
    testing::Message::Message((Message *)&local_40);
    if (in_stack_ffffffffffffffd8 ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = (in_stack_ffffffffffffffd8->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_38,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/QAngle.cpp"
               ,0x68,pcVar1);
    testing::internal::AssertHelper::operator=(&local_38,(Message *)&local_40);
    testing::internal::AssertHelper::~AssertHelper(&local_38);
    if (local_40._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_40._M_head_impl + 8))();
    }
  }
  if (in_stack_ffffffffffffffd8 !=
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&stack0xffffffffffffffd8,in_stack_ffffffffffffffd8);
  }
  testing::internal::DoubleNearPredFormat
            (in_stack_ffffffffffffffb8,(char *)0x12e81d,(char *)in_stack_ffffffffffffffe8.data_,
             (double)_Var2._M_head_impl,(double)in_stack_ffffffffffffffd8,
             (double)CONCAT71(in_stack_ffffffffffffffd1,in_stack_ffffffffffffffd0));
  if (in_stack_ffffffffffffffd0 == (internal)0x0) {
    testing::Message::Message((Message *)&local_40);
    if (in_stack_ffffffffffffffd8 ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = (in_stack_ffffffffffffffd8->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_38,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/QAngle.cpp"
               ,0x69,pcVar1);
    testing::internal::AssertHelper::operator=(&local_38,(Message *)&local_40);
    testing::internal::AssertHelper::~AssertHelper(&local_38);
    if (local_40._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_40._M_head_impl + 8))();
    }
  }
  if (in_stack_ffffffffffffffd8 !=
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&stack0xffffffffffffffd8,in_stack_ffffffffffffffd8);
  }
  testing::internal::DoubleNearPredFormat
            (in_stack_ffffffffffffffb8,(char *)0x12e8d4,(char *)in_stack_ffffffffffffffe8.data_,
             (double)_Var2._M_head_impl,(double)in_stack_ffffffffffffffd8,
             (double)CONCAT71(in_stack_ffffffffffffffd1,in_stack_ffffffffffffffd0));
  if (in_stack_ffffffffffffffd0 == (internal)0x0) {
    testing::Message::Message((Message *)&local_40);
    if (in_stack_ffffffffffffffd8 ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = (in_stack_ffffffffffffffd8->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_38,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/QAngle.cpp"
               ,0x6a,pcVar1);
    testing::internal::AssertHelper::operator=(&local_38,(Message *)&local_40);
    testing::internal::AssertHelper::~AssertHelper(&local_38);
    if (local_40._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_40._M_head_impl + 8))();
    }
  }
  if (in_stack_ffffffffffffffd8 !=
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&stack0xffffffffffffffd8,in_stack_ffffffffffffffd8);
  }
  testing::internal::DoubleNearPredFormat
            (in_stack_ffffffffffffffb8,(char *)0x12e986,(char *)in_stack_ffffffffffffffe8.data_,
             (double)_Var2._M_head_impl,(double)in_stack_ffffffffffffffd8,
             (double)CONCAT71(in_stack_ffffffffffffffd1,in_stack_ffffffffffffffd0));
  if (in_stack_ffffffffffffffd0 == (internal)0x0) {
    testing::Message::Message((Message *)&local_40);
    if (in_stack_ffffffffffffffd8 ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = (in_stack_ffffffffffffffd8->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_38,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/QAngle.cpp"
               ,0x6b,pcVar1);
    testing::internal::AssertHelper::operator=(&local_38,(Message *)&local_40);
    testing::internal::AssertHelper::~AssertHelper(&local_38);
    if (local_40._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_40._M_head_impl + 8))();
    }
  }
  if (in_stack_ffffffffffffffd8 !=
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&stack0xffffffffffffffd8,in_stack_ffffffffffffffd8);
  }
  testing::internal::DoubleNearPredFormat
            (in_stack_ffffffffffffffb8,(char *)0x12ea38,(char *)in_stack_ffffffffffffffe8.data_,
             (double)_Var2._M_head_impl,(double)in_stack_ffffffffffffffd8,
             (double)CONCAT71(in_stack_ffffffffffffffd1,in_stack_ffffffffffffffd0));
  if (in_stack_ffffffffffffffd0 == (internal)0x0) {
    testing::Message::Message((Message *)&local_40);
    if (in_stack_ffffffffffffffd8 ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = (in_stack_ffffffffffffffd8->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_38,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/QAngle.cpp"
               ,0x6c,pcVar1);
    testing::internal::AssertHelper::operator=(&local_38,(Message *)&local_40);
    testing::internal::AssertHelper::~AssertHelper(&local_38);
    if (local_40._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_40._M_head_impl + 8))();
    }
  }
  if (in_stack_ffffffffffffffd8 !=
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&stack0xffffffffffffffd8,in_stack_ffffffffffffffd8);
  }
  testing::internal::DoubleNearPredFormat
            (in_stack_ffffffffffffffb8,(char *)0x12eaea,(char *)in_stack_ffffffffffffffe8.data_,
             (double)_Var2._M_head_impl,(double)in_stack_ffffffffffffffd8,
             (double)CONCAT71(in_stack_ffffffffffffffd1,in_stack_ffffffffffffffd0));
  if (in_stack_ffffffffffffffd0 == (internal)0x0) {
    testing::Message::Message((Message *)&local_40);
    if (in_stack_ffffffffffffffd8 ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = (in_stack_ffffffffffffffd8->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_38,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/QAngle.cpp"
               ,0x6d,pcVar1);
    testing::internal::AssertHelper::operator=(&local_38,(Message *)&local_40);
    testing::internal::AssertHelper::~AssertHelper(&local_38);
    if (local_40._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_40._M_head_impl + 8))();
    }
  }
  if (in_stack_ffffffffffffffd8 !=
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&stack0xffffffffffffffd8,in_stack_ffffffffffffffd8);
  }
  testing::internal::DoubleNearPredFormat
            (in_stack_ffffffffffffffb8,(char *)0x12eb9c,(char *)in_stack_ffffffffffffffe8.data_,
             (double)_Var2._M_head_impl,(double)in_stack_ffffffffffffffd8,
             (double)CONCAT71(in_stack_ffffffffffffffd1,in_stack_ffffffffffffffd0));
  if (in_stack_ffffffffffffffd0 == (internal)0x0) {
    testing::Message::Message((Message *)&local_40);
    if (in_stack_ffffffffffffffd8 ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = (in_stack_ffffffffffffffd8->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_38,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/QAngle.cpp"
               ,0x80,pcVar1);
    testing::internal::AssertHelper::operator=(&local_38,(Message *)&local_40);
    testing::internal::AssertHelper::~AssertHelper(&local_38);
    if (local_40._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_40._M_head_impl + 8))();
    }
  }
  if (in_stack_ffffffffffffffd8 !=
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&stack0xffffffffffffffd8,in_stack_ffffffffffffffd8);
  }
  testing::internal::DoubleNearPredFormat
            (in_stack_ffffffffffffffb8,(char *)0x12ec53,(char *)in_stack_ffffffffffffffe8.data_,
             (double)_Var2._M_head_impl,(double)in_stack_ffffffffffffffd8,
             (double)CONCAT71(in_stack_ffffffffffffffd1,in_stack_ffffffffffffffd0));
  if (in_stack_ffffffffffffffd0 == (internal)0x0) {
    testing::Message::Message((Message *)&local_40);
    if (in_stack_ffffffffffffffd8 ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = (in_stack_ffffffffffffffd8->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_38,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/QAngle.cpp"
               ,0x81,pcVar1);
    testing::internal::AssertHelper::operator=(&local_38,(Message *)&local_40);
    testing::internal::AssertHelper::~AssertHelper(&local_38);
    if (local_40._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_40._M_head_impl + 8))();
    }
  }
  if (in_stack_ffffffffffffffd8 !=
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&stack0xffffffffffffffd8,in_stack_ffffffffffffffd8);
  }
  testing::internal::DoubleNearPredFormat
            (in_stack_ffffffffffffffb8,(char *)0x12ed0a,(char *)in_stack_ffffffffffffffe8.data_,
             (double)_Var2._M_head_impl,(double)in_stack_ffffffffffffffd8,
             (double)CONCAT71(in_stack_ffffffffffffffd1,in_stack_ffffffffffffffd0));
  if (in_stack_ffffffffffffffd0 == (internal)0x0) {
    testing::Message::Message((Message *)&local_40);
    if (in_stack_ffffffffffffffd8 ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = (in_stack_ffffffffffffffd8->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_38,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/QAngle.cpp"
               ,0x82,pcVar1);
    testing::internal::AssertHelper::operator=(&local_38,(Message *)&local_40);
    testing::internal::AssertHelper::~AssertHelper(&local_38);
    if (local_40._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_40._M_head_impl + 8))();
    }
  }
  if (in_stack_ffffffffffffffd8 !=
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&stack0xffffffffffffffd8,in_stack_ffffffffffffffd8);
  }
  testing::internal::DoubleNearPredFormat
            (in_stack_ffffffffffffffb8,(char *)0x12edbc,(char *)in_stack_ffffffffffffffe8.data_,
             (double)_Var2._M_head_impl,(double)in_stack_ffffffffffffffd8,
             (double)CONCAT71(in_stack_ffffffffffffffd1,in_stack_ffffffffffffffd0));
  if (in_stack_ffffffffffffffd0 == (internal)0x0) {
    testing::Message::Message((Message *)&local_40);
    if (in_stack_ffffffffffffffd8 ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = (in_stack_ffffffffffffffd8->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_38,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/QAngle.cpp"
               ,0x83,pcVar1);
    testing::internal::AssertHelper::operator=(&local_38,(Message *)&local_40);
    testing::internal::AssertHelper::~AssertHelper(&local_38);
    if (local_40._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_40._M_head_impl + 8))();
    }
  }
  if (in_stack_ffffffffffffffd8 !=
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&stack0xffffffffffffffd8,in_stack_ffffffffffffffd8);
  }
  testing::internal::DoubleNearPredFormat
            (in_stack_ffffffffffffffb8,(char *)0x12ee6e,(char *)in_stack_ffffffffffffffe8.data_,
             (double)_Var2._M_head_impl,(double)in_stack_ffffffffffffffd8,
             (double)CONCAT71(in_stack_ffffffffffffffd1,in_stack_ffffffffffffffd0));
  if (in_stack_ffffffffffffffd0 == (internal)0x0) {
    testing::Message::Message((Message *)&local_40);
    if (in_stack_ffffffffffffffd8 ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = (in_stack_ffffffffffffffd8->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_38,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/QAngle.cpp"
               ,0x84,pcVar1);
    testing::internal::AssertHelper::operator=(&local_38,(Message *)&local_40);
    testing::internal::AssertHelper::~AssertHelper(&local_38);
    if (local_40._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_40._M_head_impl + 8))();
    }
  }
  if (in_stack_ffffffffffffffd8 !=
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&stack0xffffffffffffffd8,in_stack_ffffffffffffffd8);
  }
  testing::internal::DoubleNearPredFormat
            (in_stack_ffffffffffffffb8,(char *)0x12ef20,(char *)in_stack_ffffffffffffffe8.data_,
             (double)_Var2._M_head_impl,(double)in_stack_ffffffffffffffd8,
             (double)CONCAT71(in_stack_ffffffffffffffd1,in_stack_ffffffffffffffd0));
  if (in_stack_ffffffffffffffd0 == (internal)0x0) {
    testing::Message::Message((Message *)&local_40);
    if (in_stack_ffffffffffffffd8 ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = (in_stack_ffffffffffffffd8->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_38,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/QAngle.cpp"
               ,0x85,pcVar1);
    testing::internal::AssertHelper::operator=(&local_38,(Message *)&local_40);
    testing::internal::AssertHelper::~AssertHelper(&local_38);
    if (local_40._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_40._M_head_impl + 8))();
    }
  }
  if (in_stack_ffffffffffffffd8 !=
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&stack0xffffffffffffffd8,in_stack_ffffffffffffffd8);
  }
  testing::internal::DoubleNearPredFormat
            (in_stack_ffffffffffffffb8,(char *)0x12efd7,(char *)in_stack_ffffffffffffffe8.data_,
             (double)_Var2._M_head_impl,(double)in_stack_ffffffffffffffd8,
             (double)CONCAT71(in_stack_ffffffffffffffd1,in_stack_ffffffffffffffd0));
  if (in_stack_ffffffffffffffd0 == (internal)0x0) {
    testing::Message::Message((Message *)&local_40);
    if (in_stack_ffffffffffffffd8 ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = (in_stack_ffffffffffffffd8->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_38,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/QAngle.cpp"
               ,0x98,pcVar1);
    testing::internal::AssertHelper::operator=(&local_38,(Message *)&local_40);
    testing::internal::AssertHelper::~AssertHelper(&local_38);
    if (local_40._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_40._M_head_impl + 8))();
    }
  }
  if (in_stack_ffffffffffffffd8 !=
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&stack0xffffffffffffffd8,in_stack_ffffffffffffffd8);
  }
  testing::internal::DoubleNearPredFormat
            (in_stack_ffffffffffffffb8,(char *)0x12f08e,(char *)in_stack_ffffffffffffffe8.data_,
             (double)_Var2._M_head_impl,(double)in_stack_ffffffffffffffd8,
             (double)CONCAT71(in_stack_ffffffffffffffd1,in_stack_ffffffffffffffd0));
  if (in_stack_ffffffffffffffd0 == (internal)0x0) {
    testing::Message::Message((Message *)&local_40);
    if (in_stack_ffffffffffffffd8 ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = (in_stack_ffffffffffffffd8->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_38,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/QAngle.cpp"
               ,0x99,pcVar1);
    testing::internal::AssertHelper::operator=(&local_38,(Message *)&local_40);
    testing::internal::AssertHelper::~AssertHelper(&local_38);
    if (local_40._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_40._M_head_impl + 8))();
    }
  }
  if (in_stack_ffffffffffffffd8 !=
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&stack0xffffffffffffffd8,in_stack_ffffffffffffffd8);
  }
  testing::internal::DoubleNearPredFormat
            (in_stack_ffffffffffffffb8,(char *)0x12f145,(char *)in_stack_ffffffffffffffe8.data_,
             (double)_Var2._M_head_impl,(double)in_stack_ffffffffffffffd8,
             (double)CONCAT71(in_stack_ffffffffffffffd1,in_stack_ffffffffffffffd0));
  if (in_stack_ffffffffffffffd0 == (internal)0x0) {
    testing::Message::Message((Message *)&local_40);
    if (in_stack_ffffffffffffffd8 ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = (in_stack_ffffffffffffffd8->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_38,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/QAngle.cpp"
               ,0x9a,pcVar1);
    testing::internal::AssertHelper::operator=(&local_38,(Message *)&local_40);
    testing::internal::AssertHelper::~AssertHelper(&local_38);
    if (local_40._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_40._M_head_impl + 8))();
    }
  }
  if (in_stack_ffffffffffffffd8 !=
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&stack0xffffffffffffffd8,in_stack_ffffffffffffffd8);
  }
  testing::internal::DoubleNearPredFormat
            (in_stack_ffffffffffffffb8,(char *)0x12f1f7,(char *)in_stack_ffffffffffffffe8.data_,
             (double)_Var2._M_head_impl,(double)in_stack_ffffffffffffffd8,
             (double)CONCAT71(in_stack_ffffffffffffffd1,in_stack_ffffffffffffffd0));
  if (in_stack_ffffffffffffffd0 == (internal)0x0) {
    testing::Message::Message((Message *)&local_40);
    if (in_stack_ffffffffffffffd8 ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = (in_stack_ffffffffffffffd8->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_38,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/QAngle.cpp"
               ,0xa1,pcVar1);
    testing::internal::AssertHelper::operator=(&local_38,(Message *)&local_40);
    testing::internal::AssertHelper::~AssertHelper(&local_38);
    if (local_40._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_40._M_head_impl + 8))();
    }
  }
  if (in_stack_ffffffffffffffd8 !=
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&stack0xffffffffffffffd8,in_stack_ffffffffffffffd8);
  }
  testing::internal::DoubleNearPredFormat
            (in_stack_ffffffffffffffb8,(char *)0x12f2ae,(char *)in_stack_ffffffffffffffe8.data_,
             (double)_Var2._M_head_impl,(double)in_stack_ffffffffffffffd8,
             (double)CONCAT71(in_stack_ffffffffffffffd1,in_stack_ffffffffffffffd0));
  if (in_stack_ffffffffffffffd0 == (internal)0x0) {
    testing::Message::Message((Message *)&local_40);
    if (in_stack_ffffffffffffffd8 ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = (in_stack_ffffffffffffffd8->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_38,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/QAngle.cpp"
               ,0xa2,pcVar1);
    testing::internal::AssertHelper::operator=(&local_38,(Message *)&local_40);
    testing::internal::AssertHelper::~AssertHelper(&local_38);
    if (local_40._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_40._M_head_impl + 8))();
    }
  }
  if (in_stack_ffffffffffffffd8 !=
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&stack0xffffffffffffffd8,in_stack_ffffffffffffffd8);
  }
  testing::internal::DoubleNearPredFormat
            (in_stack_ffffffffffffffb8,(char *)0x12f365,(char *)in_stack_ffffffffffffffe8.data_,
             (double)_Var2._M_head_impl,(double)in_stack_ffffffffffffffd8,
             (double)CONCAT71(in_stack_ffffffffffffffd1,in_stack_ffffffffffffffd0));
  if (in_stack_ffffffffffffffd0 == (internal)0x0) {
    testing::Message::Message((Message *)&local_40);
    if (in_stack_ffffffffffffffd8 ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = (in_stack_ffffffffffffffd8->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_38,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/QAngle.cpp"
               ,0xa3,pcVar1);
    testing::internal::AssertHelper::operator=(&local_38,(Message *)&local_40);
    testing::internal::AssertHelper::~AssertHelper(&local_38);
    if (local_40._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_40._M_head_impl + 8))();
    }
  }
  if (in_stack_ffffffffffffffd8 !=
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&stack0xffffffffffffffd8,in_stack_ffffffffffffffd8);
  }
  testing::internal::DoubleNearPredFormat
            (in_stack_ffffffffffffffb8,(char *)0x12f417,(char *)in_stack_ffffffffffffffe8.data_,
             (double)_Var2._M_head_impl,(double)in_stack_ffffffffffffffd8,
             (double)CONCAT71(in_stack_ffffffffffffffd1,in_stack_ffffffffffffffd0));
  if (in_stack_ffffffffffffffd0 == (internal)0x0) {
    testing::Message::Message((Message *)&local_40);
    if (in_stack_ffffffffffffffd8 ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = (in_stack_ffffffffffffffd8->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_38,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/QAngle.cpp"
               ,0xaf,pcVar1);
    testing::internal::AssertHelper::operator=(&local_38,(Message *)&local_40);
    testing::internal::AssertHelper::~AssertHelper(&local_38);
    if (local_40._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_40._M_head_impl + 8))();
    }
  }
  if (in_stack_ffffffffffffffd8 !=
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&stack0xffffffffffffffd8,in_stack_ffffffffffffffd8);
  }
  testing::internal::DoubleNearPredFormat
            (in_stack_ffffffffffffffb8,(char *)0x12f4c9,(char *)in_stack_ffffffffffffffe8.data_,
             (double)_Var2._M_head_impl,(double)in_stack_ffffffffffffffd8,
             (double)CONCAT71(in_stack_ffffffffffffffd1,in_stack_ffffffffffffffd0));
  if (in_stack_ffffffffffffffd0 == (internal)0x0) {
    testing::Message::Message((Message *)&local_40);
    if (in_stack_ffffffffffffffd8 ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = (in_stack_ffffffffffffffd8->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_38,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/QAngle.cpp"
               ,0xb0,pcVar1);
    testing::internal::AssertHelper::operator=(&local_38,(Message *)&local_40);
    testing::internal::AssertHelper::~AssertHelper(&local_38);
    if (local_40._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_40._M_head_impl + 8))();
    }
  }
  if (in_stack_ffffffffffffffd8 !=
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&stack0xffffffffffffffd8,in_stack_ffffffffffffffd8);
  }
  testing::internal::DoubleNearPredFormat
            (in_stack_ffffffffffffffb8,(char *)0x12f57b,(char *)in_stack_ffffffffffffffe8.data_,
             (double)_Var2._M_head_impl,(double)in_stack_ffffffffffffffd8,
             (double)CONCAT71(in_stack_ffffffffffffffd1,in_stack_ffffffffffffffd0));
  if (in_stack_ffffffffffffffd0 == (internal)0x0) {
    testing::Message::Message((Message *)&local_40);
    if (in_stack_ffffffffffffffd8 ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = (in_stack_ffffffffffffffd8->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_38,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/QAngle.cpp"
               ,0xb1,pcVar1);
    testing::internal::AssertHelper::operator=(&local_38,(Message *)&local_40);
    testing::internal::AssertHelper::~AssertHelper(&local_38);
    if (local_40._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_40._M_head_impl + 8))();
    }
  }
  if (in_stack_ffffffffffffffd8 !=
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&stack0xffffffffffffffd8,in_stack_ffffffffffffffd8);
  }
  testing::internal::DoubleNearPredFormat
            (in_stack_ffffffffffffffb8,(char *)0x12f62d,(char *)in_stack_ffffffffffffffe8.data_,
             (double)_Var2._M_head_impl,(double)in_stack_ffffffffffffffd8,
             (double)CONCAT71(in_stack_ffffffffffffffd1,in_stack_ffffffffffffffd0));
  if (in_stack_ffffffffffffffd0 == (internal)0x0) {
    testing::Message::Message((Message *)&local_40);
    if (in_stack_ffffffffffffffd8 ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = (in_stack_ffffffffffffffd8->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_38,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/QAngle.cpp"
               ,0xb2,pcVar1);
    testing::internal::AssertHelper::operator=(&local_38,(Message *)&local_40);
    testing::internal::AssertHelper::~AssertHelper(&local_38);
    if (local_40._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_40._M_head_impl + 8))();
    }
  }
  if (in_stack_ffffffffffffffd8 !=
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&stack0xffffffffffffffd8,in_stack_ffffffffffffffd8);
  }
  testing::internal::DoubleNearPredFormat
            (in_stack_ffffffffffffffb8,(char *)0x12f6df,(char *)in_stack_ffffffffffffffe8.data_,
             (double)_Var2._M_head_impl,(double)in_stack_ffffffffffffffd8,
             (double)CONCAT71(in_stack_ffffffffffffffd1,in_stack_ffffffffffffffd0));
  if (in_stack_ffffffffffffffd0 == (internal)0x0) {
    testing::Message::Message((Message *)&local_40);
    if (in_stack_ffffffffffffffd8 ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = (in_stack_ffffffffffffffd8->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_38,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/QAngle.cpp"
               ,0xb3,pcVar1);
    testing::internal::AssertHelper::operator=(&local_38,(Message *)&local_40);
    testing::internal::AssertHelper::~AssertHelper(&local_38);
    if (local_40._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_40._M_head_impl + 8))();
    }
  }
  if (in_stack_ffffffffffffffd8 !=
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&stack0xffffffffffffffd8,in_stack_ffffffffffffffd8);
  }
  testing::internal::DoubleNearPredFormat
            (in_stack_ffffffffffffffb8,(char *)0x12f791,(char *)in_stack_ffffffffffffffe8.data_,
             (double)_Var2._M_head_impl,(double)in_stack_ffffffffffffffd8,
             (double)CONCAT71(in_stack_ffffffffffffffd1,in_stack_ffffffffffffffd0));
  if (in_stack_ffffffffffffffd0 == (internal)0x0) {
    testing::Message::Message((Message *)&local_40);
    if (in_stack_ffffffffffffffd8 ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = (in_stack_ffffffffffffffd8->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_38,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/QAngle.cpp"
               ,0xb4,pcVar1);
    testing::internal::AssertHelper::operator=(&local_38,(Message *)&local_40);
    testing::internal::AssertHelper::~AssertHelper(&local_38);
    if (local_40._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_40._M_head_impl + 8))();
    }
  }
  if (in_stack_ffffffffffffffd8 !=
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&stack0xffffffffffffffd8,in_stack_ffffffffffffffd8);
  }
  return;
}

Assistant:

void test_qclab_QAngle() {

  const T pi = 4 * std::atan(1) ;
  const T tol = 10 * std::numeric_limits< T >::epsilon() ;

  {
    qclab::QAngle< T >  angle ;

    EXPECT_EQ( angle.cos() , 1 ) ;    // cos
    EXPECT_EQ( angle.sin() , 0 ) ;    // sin
    EXPECT_EQ( angle.theta() , 0 ) ;  // theta

    // update(angle)
    qclab::QAngle< T >  new_angle( 1 ) ;
    angle.update( new_angle ) ;
    EXPECT_NEAR( angle.cos() , std::cos( 1 ) , tol ) ;
    EXPECT_NEAR( angle.sin() , std::sin( 1 ) , tol ) ;
    EXPECT_NEAR( angle.theta() , 1 , tol ) ;

    // update(theta)
    angle.update( pi/2 ) ;
    EXPECT_EQ( angle.cos() , std::cos( pi/2 ) ) ;
    EXPECT_EQ( angle.sin() , std::sin( pi/2 ) ) ;
    EXPECT_NEAR( angle.theta() , pi/2 , tol ) ;

    // update(cos,sin)
    angle.update( std::cos( pi/3 ) , std::sin( pi/3 ) ) ;
    EXPECT_EQ( angle.cos() , std::cos( pi/3 ) ) ;
    EXPECT_EQ( angle.sin() , std::sin( pi/3 ) ) ;
    EXPECT_NEAR( angle.theta() , pi/3 , tol ) ;

    // operators == and !=
    EXPECT_TRUE( angle != new_angle ) ;
    EXPECT_FALSE( angle == new_angle ) ;
    new_angle.update( angle ) ;
    EXPECT_TRUE( angle == new_angle ) ;
    EXPECT_FALSE( angle != new_angle ) ;
  }

  {
    const T theta = 1 ;
    const T cos = std::cos( theta ) ;
    const T sin = std::sin( theta ) ;
    qclab::QAngle< T >  angle( theta ) ;

    EXPECT_NEAR( angle.cos() , cos , tol ) ;      // cos
    EXPECT_NEAR( angle.sin() , sin , tol ) ;      // sin
    EXPECT_NEAR( angle.theta() , theta , tol ) ;  // theta
  }

  {
    const T theta = pi/2 ;
    const T cos = std::cos( theta ) ;
    const T sin = std::sin( theta ) ;
    qclab::QAngle< T >  angle( theta ) ;

    EXPECT_NEAR( angle.cos() , cos , tol ) ;      // cos
    EXPECT_NEAR( angle.sin() , sin , tol ) ;      // sin
    EXPECT_NEAR( angle.theta() , theta , tol ) ;  // theta
  }

  {
    const T theta = 0.5 ;
    const T cos = std::cos( theta ) ;
    const T sin = std::sin( theta ) ;
    qclab::QAngle< T >  angle( cos , sin ) ;

    EXPECT_NEAR( angle.cos() , cos , tol ) ;      // cos
    EXPECT_NEAR( angle.sin() , sin , tol ) ;      // sin
    EXPECT_NEAR( angle.theta() , theta , tol ) ;  // theta
  }

  {
    const T theta = pi/4 ;
    const T cos = std::cos( theta ) ;
    const T sin = std::sin( theta ) ;
    qclab::QAngle< T >  angle( cos , sin ) ;

    EXPECT_EQ( angle.cos() , cos ) ;              // cos
    EXPECT_EQ( angle.sin() , sin ) ;              // sin
    EXPECT_NEAR( angle.theta() , theta , tol ) ;  // theta
  }

  {
    const T theta1 = pi/2 ;
    const T cos1 = std::cos( theta1 ) ;
    const T sin1 = std::sin( theta1 ) ;
    qclab::QAngle< T >  angle1( theta1 ) ;

    const T theta2 = pi/3 ;
    const T cos2 = std::cos( theta2 ) ;
    const T sin2 = std::sin( theta2 ) ;
    qclab::QAngle< T >  angle2( theta2 ) ;

    // operator +=
    angle1 += angle2 ;
    T theta = theta1 + theta2 ;
    T cos = std::cos( theta ) ;
    T sin = std::sin( theta ) ;
    EXPECT_NEAR( angle1.cos() , cos , tol ) ;       // cos
    EXPECT_NEAR( angle1.sin() , sin , tol ) ;       // sin
    EXPECT_NEAR( angle1.theta() , theta , tol ) ;   // theta
    EXPECT_NEAR( angle2.cos() , cos2 , tol ) ;      // cos
    EXPECT_NEAR( angle2.sin() , sin2 , tol ) ;      // sin
    EXPECT_NEAR( angle2.theta() , theta2 , tol ) ;  // theta
  }

  {
    const T theta1 = pi/2 ;
    const T cos1 = std::cos( theta1 ) ;
    const T sin1 = std::sin( theta1 ) ;
    qclab::QAngle< T >  angle1( theta1 ) ;

    const T theta2 = pi/3 ;
    const T cos2 = std::cos( theta2 ) ;
    const T sin2 = std::sin( theta2 ) ;
    qclab::QAngle< T >  angle2( theta2 ) ;

    // operator -=
    angle1 -= angle2 ;
    T theta = theta1 - theta2 ;
    T cos = std::cos( theta ) ;
    T sin = std::sin( theta ) ;
    EXPECT_NEAR( angle1.cos() , cos , tol ) ;       // cos
    EXPECT_NEAR( angle1.sin() , sin , tol ) ;       // sin
    EXPECT_NEAR( angle1.theta() , theta , tol ) ;   // theta
    EXPECT_NEAR( angle2.cos() , cos2 , tol ) ;      // cos
    EXPECT_NEAR( angle2.sin() , sin2 , tol ) ;      // sin
    EXPECT_NEAR( angle2.theta() , theta2 , tol ) ;  // theta
  }

  {
    const T theta1 = pi/2 ;
    const T cos1 = std::cos( theta1 ) ;
    const T sin1 = std::sin( theta1 ) ;
    qclab::QAngle< T >  angle1( theta1 ) ;

    const T theta2 = pi/3 ;
    const T cos2 = std::cos( theta2 ) ;
    const T sin2 = std::sin( theta2 ) ;
    qclab::QAngle< T >  angle2( theta2 ) ;

    // operator +
    qclab::QAngle< T > sum = angle1 + angle2 ;
    T theta = theta1 + theta2 ;
    T cos = std::cos( theta ) ;
    T sin = std::sin( theta ) ;
    EXPECT_NEAR( sum.cos() , cos , tol ) ;      // cos
    EXPECT_NEAR( sum.sin() , sin , tol ) ;      // sin
    EXPECT_NEAR( sum.theta() , theta , tol ) ;  // theta

    // operator -
    qclab::QAngle< T > minus = angle1 - angle2 ;
    theta = theta1 - theta2 ;
    cos = std::cos( theta ) ;
    sin = std::sin( theta ) ;
    EXPECT_NEAR( minus.cos() , cos , tol ) ;      // cos
    EXPECT_NEAR( minus.sin() , sin , tol ) ;      // sin
    EXPECT_NEAR( minus.theta() , theta , tol ) ;  // theta
  }

  {
    const T theta = 1 ;
    const T cos = std::cos( theta ) ;
    const T sin = std::sin( theta ) ;
    qclab::QAngle< T >  angle1( theta ) ;
    qclab::QAngle< T >  angle2 ;

    // operator -
    angle2 = -angle1 ;
    EXPECT_NEAR( angle1.cos() ,  cos , tol ) ;      // cos
    EXPECT_NEAR( angle1.sin() , sin , tol ) ;       // sin
    EXPECT_NEAR( angle1.theta() , theta , tol ) ;   // theta
    EXPECT_NEAR( angle2.cos() ,  cos , tol ) ;      // cos
    EXPECT_NEAR( angle2.sin() , -sin , tol ) ;      // sin
    EXPECT_NEAR( angle2.theta() , -theta , tol ) ;  // theta
  }

}